

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O0

int __thiscall FormatTypeEDSK::GetNbRevolutions(FormatTypeEDSK *this,int side,int track)

{
  uint uVar1;
  uint local_2c;
  uint local_28;
  uint nb_read;
  uint theorical_size;
  uint size_of_track;
  uint s;
  uint nb_computed_revolution;
  int track_local;
  int side_local;
  FormatTypeEDSK *this_local;
  
  size_of_track = 1;
  for (theorical_size = 0; theorical_size < this->side_[side].tracks[track].nb_sector;
      theorical_size = theorical_size + 1) {
    uVar1 = (uint)this->side_[side].tracks[track].sectors[theorical_size].actual_size;
    local_28 = 0x80 << (this->side_[side].tracks[track].sectors[theorical_size].sector_size & 0x1f);
    if (local_28 == 0) {
      local_28 = uVar1;
    }
    local_2c = uVar1 / local_28;
    if (uVar1 % local_28 != 0) {
      local_2c = 1;
    }
    this->side_[side].tracks[track].sectors[theorical_size].nb_recorded_revolutions = local_2c;
    if (size_of_track < local_2c) {
      size_of_track = local_2c;
    }
  }
  return size_of_track;
}

Assistant:

int FormatTypeEDSK::GetNbRevolutions(int side, int track)
{
   unsigned int nb_computed_revolution = 1;
   for (unsigned int s = 0; s < side_[side].tracks[track].nb_sector; s++)
   {
      // - n datas of sector (512 by default)
      unsigned int size_of_track = side_[side].tracks[track].sectors[s].actual_size;
      unsigned int theorical_size = (0x80 << (side_[side].tracks[track].sectors[s].sector_size));

      // Do we have multiple read ?
      if (theorical_size == 0) theorical_size = size_of_track;

      unsigned int nb_read = (size_of_track / theorical_size);

      if (size_of_track % theorical_size != 0)
         nb_read = 1;

      side_[side].tracks[track].sectors[s].nb_recorded_revolutions = nb_read;
      if (nb_read > nb_computed_revolution) nb_computed_revolution = nb_read;
   }
   return nb_computed_revolution;
}